

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCAABBTree.cpp
# Opt level: O2

int __thiscall chrono::collision::CHAABBTree::ResetModel(CHAABBTree *this)

{
  ChCollisionTree::ResetModel(&this->super_ChCollisionTree);
  std::vector<chrono::collision::CHAABB,_std::allocator<chrono::collision::CHAABB>_>::clear
            (&this->b);
  this->current_box = 0;
  return 0;
}

Assistant:

int CHAABBTree::ResetModel() {
    // INHERIT PARENT CLASS RESET FUNCTION
    ChCollisionTree::ResetModel();

    b.clear();

    current_box = 0;

    return ChC_OK;
}